

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptProxy::IsExtensible(JavascriptProxy *this)

{
  code *pcVar1;
  anon_class_32_4_be519e99 implicitCall;
  bool bVar2;
  int iVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  HostScriptContext *this_00;
  RecyclableObject *pRVar6;
  RecyclableObject *pRVar7;
  JavascriptFunction *function;
  undefined4 *puVar8;
  Var aValue;
  BOOL targetIsExtensible;
  BOOL trapResult;
  Var isExtensibleResult;
  JavascriptFunction *isExtensibleMethod;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  ScriptContext *requestContext;
  ThreadContext *threadContext;
  JavascriptProxy *this_local;
  
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  bVar2 = ThreadContext::IsDisableImplicitCall(pTVar5);
  if (bVar2) {
    ThreadContext::AddImplicitCallFlags(pTVar5,ImplicitCall_External);
    this_local._4_4_ = 0;
  }
  else {
    this_00 = ThreadContext::GetPreviousHostScriptContext(pTVar5);
    pSVar4 = HostScriptContext::GetScriptContext(this_00);
    pRVar6 = MarshalHandler(this,pSVar4);
    if (pRVar6 == (RecyclableObject *)0x0) {
      bVar2 = ThreadContext::RecordImplicitException(pTVar5);
      if (bVar2) {
        pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ea15,L"isExtensible");
      }
      this_local._4_4_ = 0;
    }
    else {
      pRVar7 = MarshalTarget(this,pSVar4);
      function = GetMethodHelper(this,0xc0,pSVar4);
      bVar2 = ScriptContext::IsHeapEnumInProgress(pSVar4);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x496,"(!requestContext->IsHeapEnumInProgress())",
                                    "!requestContext->IsHeapEnumInProgress()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (function == (JavascriptFunction *)0x0) {
        this_local._4_4_ =
             (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[0x33])();
      }
      else {
        implicitCall.isExtensibleMethod = function;
        implicitCall.threadContext = pTVar5;
        implicitCall.handlerObj = pRVar6;
        implicitCall.targetObj = pRVar7;
        aValue = ThreadContext::ExecuteImplicitCall<Js::JavascriptProxy::IsExtensible()::__0>
                           (pTVar5,(RecyclableObject *)function,ImplicitCall_Accessor,implicitCall);
        this_local._4_4_ = JavascriptConversion::ToBoolean(aValue,pSVar4);
        iVar3 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x33])();
        if (this_local._4_4_ != iVar3) {
          JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ea14,L"isExtensible");
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::IsExtensible()
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        // Caller does not pass requestContext. Retrieve from host scriptContext stack.
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        //1. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //2. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("isExtensible"));
        }

        //3. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        //4. Let trap be the result of GetMethod(handler, "isExtensible").
        //5. ReturnIfAbrupt(trap).
        //6. If trap is undefined, then
        //a.Return the result of calling the[[IsExtensible]] internal method of target.
        //7. Let trapResult be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target.
        //8. Let booleanTrapResult be ToBoolean(trapResult).
        //9. ReturnIfAbrupt(booleanTrapResult).
        //10. Let targetResult be the result of calling the[[IsExtensible]] internal method of target.
        //11. ReturnIfAbrupt(targetResult).
        //12. If SameValue(booleanTrapResult, targetResult) is false, then throw a TypeError exception.
        //13. Return booleanTrapResult.
        JavascriptFunction* isExtensibleMethod = GetMethodHelper(PropertyIds::isExtensible, requestContext);
        Assert(!requestContext->IsHeapEnumInProgress());
        if (nullptr == isExtensibleMethod)
        {
            return targetObj->IsExtensible();
        }

        Var isExtensibleResult = threadContext->ExecuteImplicitCall(isExtensibleMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, isExtensibleMethod, CallInfo(CallFlags_Value, 2), handlerObj, targetObj);
        });

        BOOL trapResult = JavascriptConversion::ToBoolean(isExtensibleResult, requestContext);
        BOOL targetIsExtensible = targetObj->IsExtensible();
        if (trapResult != targetIsExtensible)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("isExtensible"));
        }
        return trapResult;
    }